

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O0

int __thiscall
lsim::StringProperty::clone
          (StringProperty *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *key;
  char *value;
  StringProperty *this_local;
  
  key = (char *)(**(code **)(*(long *)__fn + 0x10))();
  value = (char *)std::__cxx11::string::c_str();
  make_property((lsim *)this,key,value);
  return (int)this;
}

Assistant:

Property::uptr_t StringProperty::clone() const {
    return make_property(key(), m_value.c_str());
}